

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_BREATH(effect_handler_context_t *context)

{
  _Bool _Var1;
  uint32_t uVar2;
  monster *mon_00;
  monster *pmVar3;
  source origin;
  wchar_t local_74;
  wchar_t local_70;
  int local_50;
  wchar_t dir;
  wchar_t accuracy;
  wchar_t conf_level;
  monster *t_mon;
  monster *mon;
  wchar_t rad;
  wchar_t flg;
  wchar_t degrees_of_arc;
  wchar_t diameter_of_source;
  loc_conflict target;
  wchar_t type;
  wchar_t dam;
  effect_handler_context_t *context_local;
  
  target.y = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  target.x = context->subtype;
  _degrees_of_arc = (loc_conflict)loc(-1,-1);
  flg = L'\x04';
  if (context->other < L'\x14') {
    local_70 = L'\x14';
  }
  else {
    local_70 = context->other;
  }
  mon._4_4_ = L'Ѱ';
  if (context->radius == L'\0') {
    local_74 = (wchar_t)z_info->max_range;
  }
  else {
    local_74 = context->radius;
  }
  if ((context->origin).what == SRC_MONSTER) {
    mon_00 = (monster *)cave_monster(cave,(context->origin).which.monster);
    pmVar3 = monster_target_monster((effect_handler_context_t_conflict *)context);
    local_50 = 100;
    mon._4_4_ = L'౰';
    for (dir = monster_effect_level(mon_00,L'\x02'); dir != L'\0'; dir = dir + L'\xffffffff') {
      local_50 = (local_50 * 0x3c) / 100;
    }
    uVar2 = Rand_div(100);
    if (local_50 < (int)(uVar2 + 1)) {
      uVar2 = Rand_div(9);
      _degrees_of_arc = (loc_conflict)loc_sum((loc)mon_00->grid,ddgrid[(int)(uVar2 + 1)]);
    }
    else if (pmVar3 == (monster *)0x0) {
      _Var1 = monster_is_decoyed(mon_00);
      if (_Var1) {
        _degrees_of_arc = (loc_conflict)cave_find_decoy(cave);
      }
      else {
        degrees_of_arc = (player->grid).x;
        unique0x00012004 = (player->grid).y;
      }
    }
    else {
      _degrees_of_arc = pmVar3->grid;
    }
    target.y = breath_dam(target.x,(int)mon_00->hp);
    _Var1 = monster_is_powerful(mon_00);
    if (_Var1) {
      flg = L'\x06';
    }
  }
  else if ((context->origin).what == SRC_PLAYER) {
    msgt(projections[target.x].msgt,"You breathe %s.",projections[target.x].desc);
    if ((context->dir == L'\x05') && (_Var1 = target_okay(), _Var1)) {
      target_get((loc *)&degrees_of_arc);
    }
    else {
      _degrees_of_arc = (loc_conflict)loc_sum(player->grid,ddgrid[context->dir]);
    }
  }
  if ((local_70 < L'<') && (flg = (flg * 0x3c) / local_70, L'\x19' < flg)) {
    flg = L'\x19';
  }
  origin._4_4_ = 0;
  origin.what = (context->origin).what;
  origin.which.trap = (context->origin).which.trap;
  _Var1 = project(origin,local_74,_degrees_of_arc,target.y,target.x,mon._4_4_,local_70,(uint8_t)flg,
                  context->obj);
  if (_Var1) {
    context->ident = true;
  }
  return true;
}

Assistant:

bool effect_handler_BREATH(effect_handler_context_t *context)
{
	int dam = effect_calculate_value(context, false);
	int type = context->subtype;

	struct loc target = loc(-1, -1);

	/* Diameter of source starts at 4, so full strength up to 3 grids from
	 * the breather. */
	int diameter_of_source = 4;

	/* Minimum breath width is 20 degrees */
	int degrees_of_arc = MAX(context->other, 20);

	int flg = PROJECT_ARC | PROJECT_GRID | PROJECT_ITEM | PROJECT_KILL;

	/* Distance breathed generally has no fixed limit. */
	int rad = context->radius ? context->radius : z_info->max_range;

	/* Player or monster? */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		struct monster *t_mon = monster_target_monster(context);
		int conf_level, accuracy = 100;

		flg |= PROJECT_PLAY;

		conf_level = monster_effect_level(mon, MON_TMD_CONF);
		while (conf_level) {
			accuracy *= (100 - CONF_RANDOM_CHANCE);
			accuracy /= 100;
			conf_level--;
		}

		if (randint1(100) > accuracy) {
			/* Confused direction. */
			int dir = randint1(9);

			target = loc_sum(mon->grid, ddgrid[dir]);
		} else if (t_mon) {
			/* Target monster. */
			target = t_mon->grid;
		} else {
			/* Target player. */
			if (monster_is_decoyed(mon)) {
				target = cave_find_decoy(cave);
			} else {
				target = player->grid;
			}
		}

		dam = breath_dam(type, mon->hp);

		/* Powerful monster */
		if (monster_is_powerful(mon)) {
			/* Breath is now full strength at 5 grids */
			diameter_of_source *= 3;
			diameter_of_source /= 2;
		}
	} else if (context->origin.what == SRC_PLAYER) {
		msgt(projections[type].msgt, "You breathe %s.", projections[type].desc);

		/* Ask for a target if no direction given */
		if (context->dir == DIR_TARGET && target_okay()) {
			target_get(&target);
		} else {
			target = loc_sum(player->grid, ddgrid[context->dir]);
		}
	}

	/* Adjust the diameter of the energy source */
	if (degrees_of_arc < 60) {
		/* Narrower cone means energy drops off less quickly. We now have:
		 * - 30 degree regular breath  | full strength at 7 grids
		 * - 30 degree powerful breath | full strength at 11 grids
		 * - 20 degree regular breath  | full strength at 11 grids
		 * - 20 degree powerful breath | full strength at 17 grids
		 * where grids are measured from the breather. */
		diameter_of_source = diameter_of_source * 60 / degrees_of_arc;

		/* Max */
		if (diameter_of_source > 25)
			diameter_of_source = 25;
	}

	/* Breathe at the target */
	if (project(context->origin, rad, target, dam, type, flg, degrees_of_arc,
				diameter_of_source, context->obj))
		context->ident = true;

	return true;
}